

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  string *psVar1;
  tinygltf *this;
  tinygltf *ptVar2;
  string header;
  size_type __dnew;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  undefined4 local_38;
  
  psVar1 = (string *)(local_a8 + 0x10);
  local_a8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"byteLength","");
  SerializeNumberProperty<unsigned_long>
            ((string *)local_a8._0_8_,
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,o);
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_88._M_allocated_capacity = 0x25;
  local_a8._0_8_ = psVar1;
  local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)&local_88);
  local_a8._16_8_ = local_88._M_allocated_capacity;
  (((string *)local_a8._0_8_)->_M_dataplus)._M_p = (pointer)0x7070613a61746164;
  ((string *)local_a8._0_8_)->_M_string_length = 0x6e6f69746163696c;
  (((string *)local_a8._0_8_)->field_2)._M_allocated_capacity = 0x732d746574636f2f;
  builtin_strncpy((char *)((long)&((string *)local_a8._0_8_)->field_2 + 8),"tream;ba",8);
  *(undefined8 *)((long)&((string *)local_a8._0_8_)->field_2 + 0xd) = 0x2c3436657361623b;
  local_a8._8_8_ = local_88._M_allocated_capacity;
  *(char *)((long)&(((string *)local_a8._0_8_)->_M_dataplus)._M_p + local_88._M_allocated_capacity)
       = '\0';
  this = (tinygltf *)
         (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  ptVar2 = (tinygltf *)
           (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar2 == this) {
    local_78._M_allocated_capacity._0_4_ = 0x697275;
    local_88._8_8_ = 3;
    local_88._M_allocated_capacity = (size_type)&local_78;
    SerializeStringProperty((string *)&local_78,(string *)local_a8._0_8_,o);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity == &local_78) goto LAB_00124ca7;
  }
  else {
    base64_encode_abi_cxx11_
              ((string *)&local_88,this,(uchar *)(ulong)(uint)((int)ptVar2 - (int)this),
               (uint)local_88._M_allocated_capacity);
    local_38 = 0x697275;
    local_58.field_2._8_8_ = 3;
    local_58.field_2._M_allocated_capacity = (size_type)(string *)&local_38;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    SerializeStringProperty
              ((string *)local_58.field_2._M_allocated_capacity,
               (string *)local_68._M_allocated_capacity,o);
    if ((string *)local_68._M_allocated_capacity != &local_58) {
      operator_delete((void *)local_68._M_allocated_capacity);
    }
    if ((string *)local_58.field_2._M_allocated_capacity != (string *)&local_38) {
      operator_delete((void *)local_58.field_2._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity == &local_78) goto LAB_00124ca7;
  }
  operator_delete((void *)local_88._M_allocated_capacity);
LAB_00124ca7:
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((buffer->name)._M_string_length != 0) {
    local_a8._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"name","");
    SerializeStringProperty((string *)local_a8._0_8_,(string *)(buffer->name)._M_dataplus._M_p,o);
    if ((string *)local_a8._0_8_ != psVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  SerializeExtensionMap(&buffer->extensions,o);
  SerializeExtras(&buffer->extras,o);
  return;
}

Assistant:

static void SerializeGltfBuffer(const Buffer &buffer, detail::json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  SerializeExtrasAndExtensions(buffer, o);
}